

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

void __thiscall QSQLiteResult::QSQLiteResult(QSQLiteResult *this,QSQLiteDriver *db)

{
  QSqlCachedResultPrivate *t;
  QSQLiteResultPrivate *in_RSI;
  QSQLiteResultPrivate *in_RDI;
  QSQLiteResultPrivate *d;
  QSqlResult *in_stack_ffffffffffffffe8;
  
  *(undefined ***)&in_RDI->super_QSqlCachedResultPrivate = &PTR__QSQLiteResult_002e3220;
  t = (QSqlCachedResultPrivate *)operator_new(0x108);
  QSQLiteResultPrivate::QSqlResultPrivate(in_RSI,in_stack_ffffffffffffffe8,(QSqlDriver *)in_RDI);
  QSqlCachedResult::QSqlCachedResult((QSqlCachedResult *)in_RDI,t);
  *(undefined ***)&in_RDI->super_QSqlCachedResultPrivate = &PTR__QSQLiteResult_002e3220;
  d_func((QSQLiteResult *)0x1154f0);
  QSQLiteResultPrivate::drv_d_func(in_RDI);
  QList<QSQLiteResult_*>::append((QList<QSQLiteResult_*> *)0x115513,(parameter_type)t);
  return;
}

Assistant:

QSQLiteResult::QSQLiteResult(const QSQLiteDriver* db)
    : QSqlCachedResult(*new QSQLiteResultPrivate(this, db))
{
    Q_D(QSQLiteResult);
    const_cast<QSQLiteDriverPrivate*>(d->drv_d_func())->results.append(this);
}